

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

void ReadRegTestArgs(ArgsManager *args,RegTestOptions *options)

{
  pointer __s;
  string_view source_file;
  bool bVar1;
  uint uVar2;
  bool bVar3;
  optional<bool> oVar4;
  int iVar5;
  void *pvVar6;
  uint *puVar7;
  mapped_type *pmVar8;
  Logger *pLVar9;
  runtime_error *prVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  pointer this;
  undefined8 *puVar14;
  long in_FS_OFFSET;
  string_view str;
  string_view name;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view separators;
  string_view logging_function;
  string_view str_03;
  VersionBitsParameters vbparams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vDeploymentParams;
  optional<Consensus::BuriedDeployment> buried_deployment;
  int32_t height;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> deployment_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  int *in_stack_fffffffffffffea8;
  undefined1 local_128 [32];
  long local_108;
  _Optional_payload_base<Consensus::BuriedDeployment> local_f8;
  undefined4 uStack_f4;
  undefined8 *local_f0;
  uint local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-fastprune","");
  oVar4 = ArgsManager::GetBoolArg(args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (((ushort)oVar4.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->fastprune =
         oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-testactivationheight","");
  ArgsManager::GetArgs(&local_b8,args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (this->_M_string_length == 0) {
LAB_0012abd1:
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&local_58,
                   (tinyformat *)"Invalid format (%s) for -testactivationheight=name@height.",
                   (char *)this,in_RCX);
        std::runtime_error::runtime_error(prVar10,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0012b219;
      }
      __s = (this->_M_dataplus)._M_p;
      pvVar6 = memchr(__s,0x40,this->_M_string_length);
      if ((pvVar6 == (void *)0x0) ||
         (pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)pvVar6 - (long)__s),
         pbVar12 ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff))
      goto LAB_0012abd1;
      uVar11 = 0xffffffffffffffff;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_58,this,(size_type)((long)&(pbVar12->_M_dataplus)._M_p + 1),
                 0xffffffffffffffff);
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      bVar3 = ParseInt32(str,(int32_t *)local_d8);
      args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71((int7)((ulong)uVar11 >> 8),local_d8[0] < 0x7fffffff);
      if (!bVar3 || local_d8[0] >= 0x7fffffff) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&local_78,
                   (tinyformat *)"Invalid height value (%s) for -testactivationheight=name@height.",
                   (char *)this,args_00);
        std::runtime_error::runtime_error(prVar10,(string *)&local_78);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0012b219;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_78,this,0,(size_type)pbVar12);
      name._M_str = local_78._M_dataplus._M_p;
      name._M_len = local_78._M_string_length;
      local_f8 = (_Optional_payload_base<Consensus::BuriedDeployment>)GetBuriedDeployment(name);
      uVar2 = local_d8[0];
      if (((uint)local_f8 >> 0x10 & 1) == 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&local_98,
                   (tinyformat *)"Invalid name (%s) for -testactivationheight=name@height.",
                   (char *)this,pbVar12);
        std::runtime_error::runtime_error(prVar10,(string *)&local_98);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0012b219;
      }
      puVar7 = (uint *)std::__detail::
                       _Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&options->activation_heights,(key_type *)&local_f8);
      *puVar7 = uVar2;
      in_RCX = pbVar12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        in_RCX = pbVar12;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      this = this + 1;
    } while (this != local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-vbparams","");
  bVar3 = ArgsManager::IsArgSet(args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (bVar3) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-vbparams","");
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8,args,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    puVar14 = (undefined8 *)CONCAT44(uStack_f4,local_f8);
    if (puVar14 != local_f0) {
      do {
        local_58._M_dataplus._M_p = (pointer)*puVar14;
        local_58._M_string_length = puVar14[1];
        local_78._M_dataplus._M_p._0_1_ = 0x3a;
        separators._M_str = in_R8;
        separators._M_len = (size_t)&local_78;
        util::Split<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_128 + 0x18),(util *)&local_58,(Span<const_char> *)0x1,separators);
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_108 - local_128._24_8_ >> 5) - 5);
        if (pbVar12 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      0xfffffffffffffffe) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar10,
                     "Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]"
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0012b219;
        }
        local_128._0_8_ = (pointer)0x0;
        local_128._8_8_ = 0;
        local_128._16_8_ = 0;
        str_00._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_128._24_8_ + 0x20))->_M_dataplus)._M_p;
        str_00._M_len = *(size_type *)(local_128._24_8_ + 0x28);
        bVar3 = ParseInt64(str_00,(int64_t *)local_128);
        if (!bVar3) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)"Invalid nStartTime (%s)",
                     (char *)(local_128._24_8_ + 0x20),pbVar12);
          std::runtime_error::runtime_error(prVar10,(string *)&local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0012b219;
        }
        str_01._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_128._24_8_ + 0x40))->_M_dataplus)._M_p;
        str_01._M_len = *(size_type *)(local_128._24_8_ + 0x48);
        bVar3 = ParseInt64(str_01,(int64_t *)(local_128 + 8));
        if (!bVar3) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)"Invalid nTimeout (%s)",
                     (char *)(local_128._24_8_ + 0x40),pbVar12);
          std::runtime_error::runtime_error(prVar10,(string *)&local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0012b219;
        }
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_108 - local_128._24_8_);
        if (pbVar12 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x61) {
          local_128._16_8_ = local_128._16_8_ & 0xffffffff00000000;
        }
        else {
          str_02._M_str =
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_128._24_8_ + 0x60))->_M_dataplus)._M_p;
          str_02._M_len = *(size_type *)(local_128._24_8_ + 0x68);
          bVar3 = ParseInt32(str_02,(int32_t *)(local_128 + 0x10));
          if (!bVar3) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            tinyformat::format<std::__cxx11::string>
                      (&local_58,(tinyformat *)"Invalid min_activation_height (%s)",
                       (char *)(local_128._24_8_ + 0x60),pbVar12);
            std::runtime_error::runtime_error(prVar10,(string *)&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0012b219;
          }
        }
        lVar13 = 0;
        bVar3 = true;
        while (iVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_128._24_8_,VersionBitsDeploymentInfo[lVar13].name),
              iVar5 != 0) {
          lVar13 = 1;
          bVar1 = !bVar3;
          bVar3 = false;
          if (bVar1) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            tinyformat::format<std::__cxx11::string>
                      (&local_58,(tinyformat *)"Invalid deployment (%s)",(char *)local_128._24_8_,
                       pbVar12);
            std::runtime_error::runtime_error(prVar10,(string *)&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0012b219;
          }
        }
        local_58._M_dataplus._M_p._0_2_ = (short)lVar13;
        pmVar8 = std::__detail::
                 _Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)options,(key_type *)&local_58);
        uVar11 = local_128._24_8_;
        *(undefined8 *)&pmVar8->min_activation_height = local_128._16_8_;
        pmVar8->start_time = local_128._0_8_;
        pmVar8->timeout = local_128._8_8_;
        pLVar9 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar9);
        if (bVar3) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string,long,long,int>
                    (&local_78,
                     (tinyformat *)
                     "Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n"
                     ,(char *)uVar11,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     (long *)(local_128 + 8),(long *)(local_128 + 0x10),in_stack_fffffffffffffea8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_58,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          pLVar9 = LogInstance();
          local_78._M_dataplus._M_p = (char *)0x58;
          local_78._M_string_length = 0x253bd4;
          in_stack_fffffffffffffea8 = (int *)0x58;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chainparams.cpp"
          ;
          source_file._M_len = 0x58;
          logging_function._M_str = "ReadRegTestArgs";
          logging_function._M_len = 0xf;
          in_R8 = "ReadRegTestArgs";
          str_03._M_str = local_58._M_dataplus._M_p;
          str_03._M_len = local_58._M_string_length;
          BCLog::Logger::LogPrintStr(pLVar9,str_03,logging_function,source_file,0x5e,ALL,Info);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_128 + 0x18));
        puVar14 = puVar14 + 4;
      } while (puVar14 != local_f0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0012b219:
  __stack_chk_fail();
}

Assistant:

void ReadRegTestArgs(const ArgsManager& args, CChainParams::RegTestOptions& options)
{
    if (auto value = args.GetBoolArg("-fastprune")) options.fastprune = *value;

    for (const std::string& arg : args.GetArgs("-testactivationheight")) {
        const auto found{arg.find('@')};
        if (found == std::string::npos) {
            throw std::runtime_error(strprintf("Invalid format (%s) for -testactivationheight=name@height.", arg));
        }

        const auto value{arg.substr(found + 1)};
        int32_t height;
        if (!ParseInt32(value, &height) || height < 0 || height >= std::numeric_limits<int>::max()) {
            throw std::runtime_error(strprintf("Invalid height value (%s) for -testactivationheight=name@height.", arg));
        }

        const auto deployment_name{arg.substr(0, found)};
        if (const auto buried_deployment = GetBuriedDeployment(deployment_name)) {
            options.activation_heights[*buried_deployment] = height;
        } else {
            throw std::runtime_error(strprintf("Invalid name (%s) for -testactivationheight=name@height.", arg));
        }
    }

    if (!args.IsArgSet("-vbparams")) return;

    for (const std::string& strDeployment : args.GetArgs("-vbparams")) {
        std::vector<std::string> vDeploymentParams = SplitString(strDeployment, ':');
        if (vDeploymentParams.size() < 3 || 4 < vDeploymentParams.size()) {
            throw std::runtime_error("Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]");
        }
        CChainParams::VersionBitsParameters vbparams{};
        if (!ParseInt64(vDeploymentParams[1], &vbparams.start_time)) {
            throw std::runtime_error(strprintf("Invalid nStartTime (%s)", vDeploymentParams[1]));
        }
        if (!ParseInt64(vDeploymentParams[2], &vbparams.timeout)) {
            throw std::runtime_error(strprintf("Invalid nTimeout (%s)", vDeploymentParams[2]));
        }
        if (vDeploymentParams.size() >= 4) {
            if (!ParseInt32(vDeploymentParams[3], &vbparams.min_activation_height)) {
                throw std::runtime_error(strprintf("Invalid min_activation_height (%s)", vDeploymentParams[3]));
            }
        } else {
            vbparams.min_activation_height = 0;
        }
        bool found = false;
        for (int j=0; j < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++j) {
            if (vDeploymentParams[0] == VersionBitsDeploymentInfo[j].name) {
                options.version_bits_parameters[Consensus::DeploymentPos(j)] = vbparams;
                found = true;
                LogPrintf("Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n", vDeploymentParams[0], vbparams.start_time, vbparams.timeout, vbparams.min_activation_height);
                break;
            }
        }
        if (!found) {
            throw std::runtime_error(strprintf("Invalid deployment (%s)", vDeploymentParams[0]));
        }
    }
}